

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O3

void __thiscall gv_visitor::visit(gv_visitor *this,ExtendedClassDeclaration *ptr)

{
  pointer ppDVar1;
  Declaration *second;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  pointer ppDVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  std::operator+(&local_90,"Class Declaration: ",(ptr->super_Class_declaration).name);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_40 = *plVar3;
    lStack_38 = plVar2[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar3;
    local_50 = (long *)*plVar2;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_50,(ulong)(ptr->base->_M_dataplus)._M_p);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_70.field_2._M_allocated_capacity = *psVar4;
    local_70.field_2._8_8_ = plVar2[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar4;
    local_70._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_70._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  box(this,ptr,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  ppDVar1 = (ptr->super_Class_declaration).decls.
            super__Vector_base<Declaration_*,_std::allocator<Declaration_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppDVar5 = (ptr->super_Class_declaration).decls.
                 super__Vector_base<Declaration_*,_std::allocator<Declaration_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppDVar5 != ppDVar1; ppDVar5 = ppDVar5 + 1) {
    second = *ppDVar5;
    arrow(this,ptr,second);
    (**(second->super_Base)._vptr_Base)(second,this);
  }
  return;
}

Assistant:

void gv_visitor::visit(ExtendedClassDeclaration* ptr) {
    box(ptr, "Class Declaration: " + *ptr->name + ". Extended by " + *ptr->base);

    for(auto i : ptr->decls) {
        arrow(ptr, i);
        i->accept(this);
    }
    
    //name, base
}